

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O1

void __thiscall
cs::stack_type<cs::method_base_*,_std::allocator>::destroy
          (stack_type<cs::method_base_*,_std::allocator> *this)

{
  method_base **ppmVar1;
  
  ppmVar1 = this->m_current;
  if (ppmVar1 != this->m_start) {
    this->m_current =
         (method_base **)
         (((long)this->m_start + (7 - (long)ppmVar1) & 0xfffffffffffffff8U) + (long)ppmVar1);
  }
  operator_delete(this->m_data,this->m_size << 3);
  return;
}

Assistant:

void destroy()
		{
			while (m_current != m_start)
				(--m_current)->~T();
			m_alloc.deallocate(m_data, m_size);
		}